

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status fdb_commit(fdb_file_handle *fhandle,fdb_commit_opt_t opt)

{
  long in_RDI;
  bool in_stack_000000b6;
  fdb_commit_opt_t in_stack_000000b7;
  fdb_kvs_handle *in_stack_000000b8;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    local_4 = _fdb_commit(in_stack_000000b8,in_stack_000000b7,in_stack_000000b6);
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_commit(fdb_file_handle *fhandle, fdb_commit_opt_t opt)
{
    if (!fhandle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    return _fdb_commit( fhandle->root,
                        opt,
                       !( fhandle->root->config.durability_opt &
                          FDB_DRB_ASYNC ) );
}